

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O0

void sockaddr_set_port(sockaddr *sa,uint port)

{
  uint16_t uVar1;
  sockaddr_in *sa4;
  sockaddr_in6 *sa6;
  uint port_local;
  sockaddr *sa_local;
  
  if (sa->sa_family == 10) {
    uVar1 = htons((uint16_t)port);
    *(uint16_t *)sa->sa_data = uVar1;
  }
  else if (sa->sa_family == 2) {
    uVar1 = htons((uint16_t)port);
    *(uint16_t *)sa->sa_data = uVar1;
  }
  return;
}

Assistant:

void sockaddr_set_port(const struct sockaddr *sa, unsigned int port) {
    if (sa->sa_family == AF_INET6)
    {
        struct sockaddr_in6 *sa6 = (struct sockaddr_in6 *)sa;
        sa6->sin6_port = htons(port);
    }
    else if (sa->sa_family == AF_INET)
    {
        struct sockaddr_in *sa4 = (struct sockaddr_in *)sa;
        sa4->sin_port = htons(port);
    }
}